

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2fVector * __thiscall ON_2fVector::operator=(ON_2fVector *this,double *v)

{
  double *v_local;
  ON_2fVector *this_local;
  
  if (v == (double *)0x0) {
    this->y = 0.0;
    this->x = 0.0;
  }
  else {
    this->x = (float)*v;
    this->y = (float)v[1];
  }
  return this;
}

Assistant:

ON_2fVector& ON_2fVector::operator=(const double* v)
{
  if ( v ) {
    x = (float)v[0];
    y = (float)v[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}